

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PECommander.h
# Opt level: O3

void __thiscall
WrapperInfoCommand::execute(WrapperInfoCommand *this,CmdParams *params,CmdContext *context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  PEFile *pe;
  size_t sVar2;
  ResourcesContainer *pRVar3;
  ostream *poVar4;
  size_t wrapperId;
  long lVar5;
  string local_48;
  
  pe = cmd_util::getPEFromContext(context);
  if ((pe != (PEFile *)0x0) && (pe->album != (ResourcesAlbum *)0x0)) {
    if ((pe->album->allLeafs)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"No resources!",0xd);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
      return;
    }
    cmd_util::printResourceTypes(pe);
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"wrapper type","");
    sVar2 = cmd_util::readNumber(&local_48,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (pe->album != (ResourcesAlbum *)0x0) {
      pRVar3 = ResourcesAlbum::getResourcesOfType(pe->album,(resource_type)sVar2);
      if (pRVar3 != (ResourcesContainer *)0x0) {
        lVar5 = (long)(pRVar3->wrappers).
                      super__Vector_base<ResourceContentWrapper_*,_std::allocator<ResourceContentWrapper_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pRVar3->wrappers).
                      super__Vector_base<ResourceContentWrapper_*,_std::allocator<ResourceContentWrapper_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3;
        if (lVar5 == 0) {
          return;
        }
        if (lVar5 == 1) {
          wrapperId = 0;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Wrappers count: ",0x10);
          *(uint *)(std::_Rb_tree_decrement + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::_Rb_tree_decrement + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          local_48._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"wrapperIndex","");
          wrapperId = cmd_util::readNumber(&local_48,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != paVar1) {
            operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
          }
        }
        cmd_util::dumpResourcesInfo(pe,(resource_type)sVar2,wrapperId);
        return;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"No such resource type!",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
  }
  return;
}

Assistant:

virtual void execute(CmdParams *params, CmdContext  *context)
    {
        PEFile *pe = cmd_util::getPEFromContext(context);
        if (!pe) return;

        ResourcesAlbum *album = pe->getResourcesAlbum();
        if (album == NULL) return;

        size_t dirsCount =  album->dirsCount();
        if (dirsCount == 0) {
            std::cout << "No resources!" << std::endl;
            return;
        }
        cmd_util::printResourceTypes(pe);

        pe::resource_type type = (pe::resource_type) cmd_util::readNumber("wrapper type");

        ResourcesContainer* wrappers = pe->getResourcesOfType(type);
        if (wrappers == NULL) {
            std::cout << "No such resource type!" << std::endl;
            return;
        }
        size_t wrappersCount = wrappers->count();
        if (wrappersCount == 0) {
            return;
        }
        size_t wrapperIndx = 0;
        if (wrappersCount > 1) {
            std::cout << "Wrappers count: " << std::dec << wrappersCount << std::endl;
            wrapperIndx = cmd_util::readNumber("wrapperIndex");
        }
        cmd_util::dumpResourcesInfo(pe, type, wrapperIndx);
    }